

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m4vd_vdpu2.c
# Opt level: O1

MPP_RET vdpu2_mpg4d_init(void *hal,MppHalCfg *cfg)

{
  MPP_RET MVar1;
  void *ptr;
  char *fmt;
  MppBufferGroup group;
  MppBuffer qp_table;
  MppBuffer mv_buf;
  MppBufferGroup local_38;
  MppBuffer local_30;
  MppBuffer local_28;
  
  local_38 = (MppBufferGroup)0x0;
  local_28 = (MppBuffer)0x0;
  local_30 = (MppBuffer)0x0;
  if ((hal == (void *)0x0) &&
     (_mpp_log_l(2,"hal_m4vd_vdpu2","Assertion %s failed at %s:%d\n",(char *)0x0,"hal",
                 "vdpu2_mpg4d_init",0xe8), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  MVar1 = mpp_buffer_group_get
                    (&local_38,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_m4vd_vdpu2",
                     "vdpu2_mpg4d_init");
  if (MVar1 == MPP_OK) {
    MVar1 = mpp_buffer_get_with_tag(local_38,&local_28,0x1fe00,"hal_m4vd_vdpu2","vdpu2_mpg4d_init");
    if (MVar1 != MPP_OK) {
      fmt = "failed to get mv buffer ret %d\n";
      goto LAB_00200900;
    }
    MVar1 = mpp_buffer_get_with_tag(local_38,&local_30,0x80,"hal_m4vd_vdpu2","vdpu2_mpg4d_init");
    if (MVar1 != MPP_OK) {
      fmt = "failed to get qp talbe buffer ret %d\n";
      goto LAB_00200900;
    }
    ptr = mpp_osal_calloc("vdpu2_mpg4d_init",0x27c);
    if (ptr == (void *)0x0) {
      ptr = (void *)0x0;
      _mpp_log_l(2,"hal_m4vd_vdpu2","failed to malloc register ret\n","vdpu2_mpg4d_init");
      MVar1 = MPP_ERR_MALLOC;
      goto LAB_00200919;
    }
    MVar1 = mpp_dev_init((MppDev *)((long)hal + 0x20),VPU_CLIENT_VDPU2);
    if (MVar1 == MPP_OK) {
      *(MppBufSlots *)hal = cfg->frame_slots;
      *(MppBufSlots *)((long)hal + 8) = cfg->packet_slots;
      *(MppCbCtx **)((long)hal + 0x18) = cfg->dec_cb;
      *(MppBufferGroup *)((long)hal + 0x10) = local_38;
      *(MppBuffer *)((long)hal + 0x38) = local_28;
      *(MppBuffer *)((long)hal + 0x40) = local_30;
      *(void **)((long)hal + 0x48) = ptr;
      cfg->dev = *(MppDev *)((long)hal + 0x20);
      mpp_env_get_u32("hal_mpg4d_debug",&hal_mpg4d_debug,0);
      return MPP_OK;
    }
    fmt = "mpp_dev_init failed. ret: %d\n";
  }
  else {
    fmt = "failed to get buffer group ret %d\n";
LAB_00200900:
    ptr = (void *)0x0;
  }
  _mpp_log_l(2,"hal_m4vd_vdpu2",fmt,"vdpu2_mpg4d_init",(ulong)(uint)MVar1);
LAB_00200919:
  if (ptr != (void *)0x0) {
    mpp_osal_free("vdpu2_mpg4d_init",ptr);
  }
  if (local_30 != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(local_30,"vdpu2_mpg4d_init");
    local_30 = (MppBuffer)0x0;
  }
  if (local_28 != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(local_28,"vdpu2_mpg4d_init");
    local_28 = (MppBuffer)0x0;
  }
  if (local_38 != (MppBufferGroup)0x0) {
    mpp_buffer_group_put(local_38);
  }
  return MVar1;
}

Assistant:

MPP_RET vdpu2_mpg4d_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    M4vdVdpu2Regs_t *regs = NULL;
    MppBufferGroup group = NULL;
    MppBuffer mv_buf = NULL;
    MppBuffer qp_table = NULL;
    hal_mpg4_ctx *ctx = (hal_mpg4_ctx *)hal;

    mpp_assert(hal);

    ret = mpp_buffer_group_get_internal(&group, MPP_BUFFER_TYPE_ION);
    if (ret) {
        mpp_err_f("failed to get buffer group ret %d\n", ret);
        goto ERR_RET;
    }

    ret = mpp_buffer_get(group, &mv_buf, MPEG4_MAX_MV_BUF_SIZE);
    if (ret) {
        mpp_err_f("failed to get mv buffer ret %d\n", ret);
        goto ERR_RET;
    }

    ret = mpp_buffer_get(group, &qp_table, 64 * 2 * sizeof(RK_U8));
    if (ret) {
        mpp_err_f("failed to get qp talbe buffer ret %d\n", ret);
        goto ERR_RET;
    }

    regs = mpp_calloc(M4vdVdpu2Regs_t, 1);
    if (NULL == regs) {
        mpp_err_f("failed to malloc register ret\n");
        ret = MPP_ERR_MALLOC;
        goto ERR_RET;
    }

    ret = mpp_dev_init(&ctx->dev, VPU_CLIENT_VDPU2);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        goto ERR_RET;
    }

    ctx->frm_slots  = cfg->frame_slots;
    ctx->pkt_slots  = cfg->packet_slots;
    ctx->dec_cb     = cfg->dec_cb;
    ctx->group      = group;
    ctx->mv_buf     = mv_buf;
    ctx->qp_table   = qp_table;
    ctx->regs       = regs;
    cfg->dev        = ctx->dev;

    mpp_env_get_u32("hal_mpg4d_debug", &hal_mpg4d_debug, 0);

    return ret;
ERR_RET:
    if (regs) {
        mpp_free(regs);
        regs = NULL;
    }

    if (qp_table) {
        mpp_buffer_put(qp_table);
        qp_table = NULL;
    }

    if (mv_buf) {
        mpp_buffer_put(mv_buf);
        mv_buf = NULL;
    }

    if (group) {
        mpp_buffer_group_put(group);
        group = NULL;
    }

    return ret;
}